

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

int deflate_block(BGZF *fp,int block_length)

{
  int local_24;
  int local_20;
  int ret;
  int comp_size;
  int block_length_local;
  BGZF *fp_local;
  
  local_20 = 0x10000;
  ret = block_length;
  _comp_size = fp;
  if (*(int *)fp < 0) {
    local_24 = bgzf_gzip_compress(fp,fp->compressed_block,&local_20,fp->uncompressed_block,
                                  block_length,(*(int *)fp << 3) >> 0x17);
  }
  else {
    local_24 = bgzf_compress(fp->compressed_block,&local_20,fp->uncompressed_block,block_length,
                             (*(int *)fp << 3) >> 0x17);
  }
  if (local_24 == 0) {
    _comp_size->block_offset = 0;
    fp_local._4_4_ = local_20;
  }
  else {
    *(uint *)_comp_size = *(uint *)_comp_size & 0xffff0000 | *(uint *)_comp_size & 0xffff | 1;
    fp_local._4_4_ = -1;
  }
  return fp_local._4_4_;
}

Assistant:

static int deflate_block(BGZF *fp, int block_length)
{
    int comp_size = BGZF_MAX_BLOCK_SIZE;
    int ret;
    if ( !fp->is_gzip )
        ret = bgzf_compress(fp->compressed_block, &comp_size, fp->uncompressed_block, block_length, fp->compress_level);
    else
        ret = bgzf_gzip_compress(fp, fp->compressed_block, &comp_size, fp->uncompressed_block, block_length, fp->compress_level);

    if ( ret != 0 )
    {
        fp->errcode |= BGZF_ERR_ZLIB;
        return -1;
    }
    fp->block_offset = 0;
    return comp_size;
}